

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

bool sf::priv::JoystickImpl::isConnected(uint index)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  reference pvVar4;
  uint in_EDI;
  udev_device *udevDevice;
  udev_device *in_stack_00000150;
  bool local_1;
  
  if ((anonymous_namespace)::udevMonitor == 0) {
    anon_unknown.dwarf_19d33d::updatePluggedList(in_stack_00000150);
  }
  else {
    bVar1 = anon_unknown.dwarf_19d33d::hasMonitorEvent();
    if (bVar1) {
      lVar2 = udev_monitor_receive_device((anonymous_namespace)::udevMonitor);
      anon_unknown.dwarf_19d33d::updatePluggedList(in_stack_00000150);
      if (lVar2 != 0) {
        udev_device_unref(lVar2);
      }
    }
  }
  sVar3 = std::
          vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
          ::size((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                  *)(anonymous_namespace)::joystickList);
  if (in_EDI < sVar3) {
    pvVar4 = std::
             vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
             ::operator[]((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                           *)(anonymous_namespace)::joystickList,(ulong)in_EDI);
    local_1 = (bool)(pvVar4->plugged & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool JoystickImpl::isConnected(unsigned int index)
{
    // See if we can skip scanning if udev monitor is available
    if (!udevMonitor)
    {
        // udev monitor is not available, perform a scan every query
        updatePluggedList();
    }
    else if (hasMonitorEvent())
    {
        // Check if new joysticks were added/removed since last update
        udev_device* udevDevice = udev_monitor_receive_device(udevMonitor);

        // If we can get the specific device, we check that,
        // otherwise just do a full scan if udevDevice == NULL
        updatePluggedList(udevDevice);

        if (udevDevice)
            udev_device_unref(udevDevice);
    }

    if (index >= joystickList.size())
        return false;

    // Then check if the joystick is connected
    return joystickList[index].plugged;
}